

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Vec_Bit_t * Gia_ManFindComplLuts(Gia_Man_t *pGia)

{
  Vec_Bit_t *p;
  int *__s;
  Gia_Obj_t *pGVar1;
  int iVar2;
  size_t __size;
  int iVar3;
  
  iVar2 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  p = (Vec_Bit_t *)malloc(0x10);
  p->nCap = iVar2 * 0x20;
  iVar3 = 0;
  if (iVar2 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar2 << 2;
    __s = (int *)malloc(__size);
  }
  p->pArray = __s;
  p->nSize = iVar2 * 0x20;
  memset(__s,0,__size);
  while ((iVar3 < pGia->vCos->nSize && (pGVar1 = Gia_ManCo(pGia,iVar3), pGVar1 != (Gia_Obj_t *)0x0))
        ) {
    if ((((uint)*(ulong *)pGVar1 >> 0x1d & 1) != 0) &&
       (((*(ulong *)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff)) & 0x80000000) == 0 &&
        (((uint)*(ulong *)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff)) & 0x1fffffff) != 0x1fffffff)))
       ) {
      iVar2 = Gia_ObjFaninId0p(pGia,pGVar1);
      Vec_BitWriteEntry(p,iVar2,1);
    }
    iVar3 = iVar3 + 1;
  }
  iVar2 = 0;
  while( true ) {
    if (pGia->vCos->nSize <= iVar2) {
      return p;
    }
    pGVar1 = Gia_ManCo(pGia,iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if (((*(ulong *)pGVar1 & 0x20000000) == 0 &&
         (*(ulong *)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff)) & 0x80000000) == 0) &&
       (((uint)*(ulong *)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff)) & 0x1fffffff) != 0x1fffffff)) {
      iVar3 = Gia_ObjFaninId0p(pGia,pGVar1);
      Vec_BitWriteEntry(p,iVar3,0);
    }
    iVar2 = iVar2 + 1;
  }
  return p;
}

Assistant:

Vec_Bit_t * Gia_ManFindComplLuts( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;  int i;
    // mark objects pointed by COs in negative polarity
    Vec_Bit_t * vMarks = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 1 );
    // unmark objects pointed by COs in positive polarity
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 0 );
    return vMarks;
}